

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>::
ShadedRenderer(ShadedRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
               *this,GetterYs<unsigned_short> *getter1,GetterYRef *getter2,
              TransformerLinLog *transformer,ImU32 col)

{
  double dVar1;
  ImVec2 IVar2;
  double dVar3;
  int iVar4;
  ImPlotPlot *pIVar5;
  GetterYRef *pGVar6;
  TransformerLinLog *pTVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  double dVar10;
  double dVar11;
  ImPlotContext *pIVar12;
  int iVar13;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar4 = getter1->Count;
  iVar13 = getter2->Count;
  if (iVar4 < getter2->Count) {
    iVar13 = iVar4;
  }
  this->Prims = iVar13 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar12 = GImPlot;
  (this->P12).y = 0.0;
  dVar3 = getter1->X0;
  dVar11 = getter1->XScale;
  dVar10 = log10((double)*(ushort *)
                          ((long)getter1->Ys +
                          (long)((getter1->Offset % iVar4 + iVar4) % iVar4) * (long)getter1->Stride)
                 / GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
  iVar4 = transformer->YAxis;
  pIVar5 = pIVar12->CurrentPlot;
  dVar1 = pIVar5->YAxis[iVar4].Range.Min;
  IVar2 = pIVar12->PixelRange[iVar4].Min;
  IVar8.y = (float)(pIVar12->My[iVar4] *
                    ((dVar1 + (double)(float)(dVar10 / pIVar12->LogDenY[iVar4]) *
                              (pIVar5->YAxis[iVar4].Range.Max - dVar1)) - dVar1) + (double)IVar2.y);
  IVar8.x = (float)(pIVar12->Mx * ((dVar3 + dVar11 * 0.0) - (pIVar5->XAxis).Range.Min) +
                   (double)IVar2.x);
  this->P11 = IVar8;
  pIVar12 = GImPlot;
  pGVar6 = this->Getter2;
  pTVar7 = this->Transformer;
  dVar1 = pGVar6->XScale;
  dVar10 = pGVar6->X0;
  dVar11 = log10(pGVar6->YRef / GImPlot->CurrentPlot->YAxis[pTVar7->YAxis].Range.Min);
  iVar4 = pTVar7->YAxis;
  pIVar5 = pIVar12->CurrentPlot;
  dVar3 = pIVar5->YAxis[iVar4].Range.Min;
  IVar2 = pIVar12->PixelRange[iVar4].Min;
  IVar9.y = (float)(pIVar12->My[iVar4] *
                    ((dVar3 + (double)(float)(dVar11 / pIVar12->LogDenY[iVar4]) *
                              (pIVar5->YAxis[iVar4].Range.Max - dVar3)) - dVar3) + (double)IVar2.y);
  IVar9.x = (float)(pIVar12->Mx * ((dVar10 + dVar1 * 0.0) - (pIVar5->XAxis).Range.Min) +
                   (double)IVar2.x);
  this->P12 = IVar9;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }